

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::try_reentrant_pop(lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                    *this)

{
  reentrant_consume_operation operation;
  reentrant_consume_operation local_20;
  
  try_start_reentrant_consume(&local_20,this);
  if (0xf < local_20.m_consume_data.m_next_ptr) {
    reentrant_consume_operation::commit(&local_20);
  }
  reentrant_consume_operation::~reentrant_consume_operation(&local_20);
  return 0xf < local_20.m_consume_data.m_next_ptr;
}

Assistant:

bool try_reentrant_pop() noexcept
        {
            if (auto operation = try_start_reentrant_consume())
            {
                operation.commit();
                return true;
            }
            return false;
        }